

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O0

void mxx::impl::allgather_big<std::pair<int,double>>
               (pair<int,_double> *data,size_t size,pair<int,_double> *out,comm *comm)

{
  MPI_Datatype poVar1;
  MPI_Datatype poVar2;
  MPI_Comm poVar3;
  datatype local_58;
  undefined1 local_40 [8];
  datatype dt;
  comm *comm_local;
  pair<int,_double> *out_local;
  size_t size_local;
  pair<int,_double> *data_local;
  
  dt._16_8_ = comm;
  get_datatype<std::pair<int,double>>();
  mxx::datatype::contiguous((datatype *)local_40,&local_58,size);
  mxx::datatype::~datatype(&local_58);
  poVar1 = mxx::datatype::type((datatype *)local_40);
  poVar2 = mxx::datatype::type((datatype *)local_40);
  poVar3 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)dt._16_8_);
  MPI_Allgather(data,1,poVar1,out,1,poVar2,poVar3);
  mxx::datatype::~datatype((datatype *)local_40);
  return;
}

Assistant:

void allgather_big(const T* data, size_t size, T* out, const mxx::comm& comm) {
    // implementation of scatter for messages sizes that exceed MAX_INT
    mxx::datatype dt = mxx::get_datatype<T>().contiguous(size);
    MPI_Allgather(const_cast<T*>(data), 1, dt.type(), out, 1, dt.type(), comm);
}